

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O1

int main(void)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  pointer piVar2;
  _Base_ptr p_Var3;
  istream *piVar4;
  _Base_ptr p_Var5;
  vector<int,std::allocator<int>> *pvVar6;
  mapped_type *pmVar7;
  long *plVar8;
  _Rb_tree_header *p_Var9;
  int iVar10;
  uint uVar11;
  int y;
  int q;
  int seq;
  int x;
  int op;
  int n;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dyn;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar4,&local_74);
  if (0 < local_74) {
    uVar11 = 0;
    iVar10 = 0;
    do {
      piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_68);
      piVar4 = (istream *)std::istream::operator>>(piVar4,(int *)&local_6c);
      std::istream::operator>>(piVar4,&local_7c);
      local_70 = (int)(local_6c ^ uVar11) % local_64;
      p_Var5 = &p_Var1->_M_header;
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_68 == 1) {
        for (; (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
            p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < local_70]) {
          if (local_70 <= (int)*(size_t *)(p_Var3 + 1)) {
            p_Var5 = p_Var3;
          }
        }
        p_Var9 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var9 = (_Rb_tree_header *)p_Var5,
           local_70 < (int)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var9 = p_Var1;
        }
        if (p_Var9 == p_Var1) {
          local_78 = local_7c;
          pvVar6 = (vector<int,std::allocator<int>> *)
                   std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)&local_60,&local_70);
          std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                    (pvVar6,&local_78,&local_74);
        }
        else {
          pvVar6 = (vector<int,std::allocator<int>> *)
                   std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)&local_60,&local_70);
          __position._M_current = *(int **)(pvVar6 + 8);
          if (__position._M_current == *(int **)(pvVar6 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar6,__position,&local_7c);
          }
          else {
            *__position._M_current = local_7c;
            *(int **)(pvVar6 + 8) = __position._M_current + 1;
          }
        }
      }
      else {
        pmVar7 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_60,&local_70);
        piVar2 = (pmVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = piVar2[(ulong)(long)local_7c %
                        (ulong)((long)(pmVar7->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2)
                       ];
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar11);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < local_74);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
  std::map<int, std::vector<int>> dyn;
  int n, q, op, x, y, seq, last_answer = 0;
  std::cin >> n >> q;
  for (int i = 0; i < q; ++i) {
    std::cin >> op >> x >> y;
    seq = (x ^ last_answer) % n;
    if (op == 1) {
      if (dyn.find(seq) == dyn.end()) {
        dyn[seq] = {y};
      } else {
        dyn[seq].push_back(y);
      }
    } else {
      const auto &s = dyn[seq];
      last_answer = s[y % s.size()];
      std::cout << last_answer << std::endl;
    }
  }
}